

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

AesGcmCtrV1 * __thiscall
duckdb_parquet::AesGcmCtrV1::operator=(AesGcmCtrV1 *this,AesGcmCtrV1 *other216)

{
  std::__cxx11::string::_M_assign((string *)&this->aad_prefix);
  std::__cxx11::string::_M_assign((string *)&this->aad_file_unique);
  this->supply_aad_prefix = other216->supply_aad_prefix;
  this->__isset = other216->__isset;
  return this;
}

Assistant:

AesGcmCtrV1& AesGcmCtrV1::operator=(const AesGcmCtrV1& other216) {
  aad_prefix = other216.aad_prefix;
  aad_file_unique = other216.aad_file_unique;
  supply_aad_prefix = other216.supply_aad_prefix;
  __isset = other216.__isset;
  return *this;
}